

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Browser.cxx
# Opt level: O0

void __thiscall
Fl_File_Browser::item_draw(Fl_File_Browser *this,void *p,int X,int Y,int W,int param_5)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  char cVar4;
  uint uVar5;
  Fl_Fontsize FVar6;
  Fl_Font face;
  Fl_Color FVar7;
  Fl_Color bg;
  int iVar8;
  size_t sVar9;
  Fl_File_Icon *pFVar10;
  int *piVar11;
  bool bVar12;
  int local_2874;
  int cW;
  int *columns;
  int local_2860;
  int column;
  int height;
  int width;
  char fragment [10240];
  int *local_50;
  char *ptr;
  char *t;
  Fl_Color c;
  FL_BLINE *line;
  int i;
  int param_5_local;
  int W_local;
  int Y_local;
  int X_local;
  void *p_local;
  Fl_File_Browser *this_local;
  
  sVar9 = strlen((char *)((long)p + 0x23));
  if (*(char *)((long)p + sVar9 + 0x22) == '/') {
    uVar5 = Fl_Browser_::textfont((Fl_Browser_ *)this);
    FVar6 = textsize(this);
    fl_font(uVar5 | 1,FVar6);
  }
  else {
    face = Fl_Browser_::textfont((Fl_Browser_ *)this);
    FVar6 = textsize(this);
    fl_font(face,FVar6);
  }
  if ((*(byte *)((long)p + 0x22) & 1) == 0) {
    t._4_4_ = Fl_Browser_::textcolor((Fl_Browser_ *)this);
  }
  else {
    FVar7 = Fl_Browser_::textcolor((Fl_Browser_ *)this);
    bg = Fl_Widget::selection_color((Fl_Widget *)this);
    t._4_4_ = fl_contrast(FVar7,bg);
  }
  pFVar10 = Fl_File_Icon::first();
  param_5_local = Y;
  if (pFVar10 == (Fl_File_Icon *)0x0) {
    W_local = X + 1;
    i = W + -2;
  }
  else {
    if (*(long *)((long)p + 0x10) != 0) {
      pFVar10 = *(Fl_File_Icon **)((long)p + 0x10);
      bVar1 = this->iconsize_;
      bVar2 = this->iconsize_;
      FVar7 = 0x34;
      if ((*(byte *)((long)p + 0x22) & 1) != 0) {
        FVar7 = 0x5f;
      }
      iVar8 = Fl_Widget::active_r((Fl_Widget *)this);
      Fl_File_Icon::draw(pFVar10,X,Y,(uint)bVar1,(uint)bVar2,FVar7,iVar8);
    }
    W_local = this->iconsize_ + 9 + X;
    i = W - (this->iconsize_ - 10);
    local_2860 = fl_height();
    for (ptr = (char *)((long)p + 0x23); *ptr != '\0'; ptr = ptr + 1) {
      if (*ptr == '\n') {
        iVar8 = fl_height();
        local_2860 = iVar8 + local_2860;
      }
    }
    if (local_2860 < (int)(uint)this->iconsize_) {
      param_5_local = (int)((uint)this->iconsize_ - local_2860) / 2 + Y;
    }
  }
  piVar11 = Fl_Browser::column_widths(&this->super_Fl_Browser);
  column = 0;
  columns._4_4_ = 0;
  iVar8 = Fl_Widget::active_r((Fl_Widget *)this);
  if (iVar8 == 0) {
    FVar7 = fl_inactive(t._4_4_);
    fl_color(FVar7);
  }
  else {
    fl_color(t._4_4_);
  }
  local_50 = &height;
  for (ptr = (char *)((long)p + 0x23); *ptr != '\0'; ptr = ptr + 1) {
    if (*ptr == '\n') {
      *(undefined1 *)local_50 = 0;
      iVar8 = fl_height();
      fl_draw((char *)&height,W_local + column,param_5_local,i - column,iVar8,0x44,(Fl_Image *)0x0,0
             );
      column = 0;
      iVar8 = fl_height();
      param_5_local = iVar8 + param_5_local;
      columns._4_4_ = 0;
      local_50 = &height;
    }
    else {
      cVar3 = *ptr;
      cVar4 = Fl_Browser::column_char(&this->super_Fl_Browser);
      if (cVar3 == cVar4) {
        *(undefined1 *)local_50 = 0;
        local_2874 = i - column;
        if (piVar11 != (int *)0x0) {
          line._4_4_ = 0;
          while( true ) {
            bVar12 = false;
            if (line._4_4_ < columns._4_4_) {
              bVar12 = piVar11[line._4_4_] != 0;
            }
            if (!bVar12) break;
            line._4_4_ = line._4_4_ + 1;
          }
          if (piVar11[line._4_4_] != 0) {
            local_2874 = piVar11[line._4_4_];
          }
        }
        iVar8 = fl_height();
        fl_draw((char *)&height,W_local + column,param_5_local,local_2874,iVar8,0x44,(Fl_Image *)0x0
                ,0);
        columns._4_4_ = columns._4_4_ + 1;
        if (piVar11 == (int *)0x0) {
          iVar8 = fl_height();
          column = columns._4_4_ * (int)((double)iVar8 * 0.6 * 8.0);
        }
        else {
          line._4_4_ = 0;
          column = 0;
          while( true ) {
            bVar12 = false;
            if (line._4_4_ < columns._4_4_) {
              bVar12 = piVar11[line._4_4_] != 0;
            }
            if (!bVar12) break;
            column = piVar11[line._4_4_] + column;
            line._4_4_ = line._4_4_ + 1;
          }
        }
        local_50 = &height;
      }
      else {
        *(char *)local_50 = *ptr;
        local_50 = (int *)((long)local_50 + 1);
      }
    }
  }
  if (&height < local_50) {
    *(undefined1 *)local_50 = 0;
    iVar8 = fl_height();
    fl_draw((char *)&height,W_local + column,param_5_local,i - column,iVar8,0x44,(Fl_Image *)0x0,0);
  }
  return;
}

Assistant:

void
Fl_File_Browser::item_draw(void *p,	// I - List item data
                 	   int  X,	// I - Upper-lefthand X coordinate
		 	   int  Y,	// I - Upper-lefthand Y coordinate
		 	   int  W,	// I - Width of item
			   int) const	// I - Height of item
{
  int		i;			// Looping var
  FL_BLINE	*line;			// Pointer to line
  Fl_Color	c;			// Text color
  char		*t,			// Pointer into text
		*ptr,			// Pointer into fragment
		fragment[10240];	// Fragment of text
  int		width,			// Width of line
		height;			// Height of line
  int		column;			// Current column
  const int	*columns;		// Columns


  // Draw the list item text...
  line = (FL_BLINE *)p;

  if (line->txt[strlen(line->txt) - 1] == '/')
    fl_font(textfont() | FL_BOLD, textsize());
  else
    fl_font(textfont(), textsize());

  if (line->flags & SELECTED)
    c = fl_contrast(textcolor(), selection_color());
  else
    c = textcolor();

  if (Fl_File_Icon::first() == NULL)
  {
    // No icons, just draw the text...
    X ++;
    W -= 2;
  }
  else
  {
    // Draw the icon if it is set...
    if (line->data)
      ((Fl_File_Icon *)line->data)->draw(X, Y, iconsize_, iconsize_,
                                	(line->flags & SELECTED) ? FL_YELLOW :
				                                   FL_LIGHT2,
					active_r());

    // Draw the text offset to the right...
    X += iconsize_ + 9;
    W -= iconsize_ - 10;

    // Center the text vertically...
    height = fl_height();

    for (t = line->txt; *t != '\0'; t ++)
      if (*t == '\n')
	height += fl_height();

    if (height < iconsize_)
      Y += (iconsize_ - height) / 2;
  }

  // Draw the text...
  line    = (FL_BLINE *)p;
  columns = column_widths();
  width   = 0;
  column  = 0;

  if (active_r())
    fl_color(c);
  else
    fl_color(fl_inactive(c));

  for (t = line->txt, ptr = fragment; *t != '\0'; t ++) {
    if (*t == '\n') {
      // Newline - nul terminate this fragment and draw it...
      *ptr = '\0';

      fl_draw(fragment, X + width, Y, W - width, fl_height(),
              (Fl_Align)(FL_ALIGN_LEFT | FL_ALIGN_CLIP), 0, 0);

      // Point back to the start of the fragment...
      ptr    = fragment;
      width  = 0;
      Y      += fl_height();
      column = 0;
    } else if (*t == column_char()) {
      // Tab - nul terminate this fragment and draw it...
      *ptr = '\0';

      int cW = W - width; // Clip width...

      if (columns) {
	// Try clipping inside this column...
	for (i = 0; i < column && columns[i]; i ++) { ; }

	if (columns[i])
	  cW = columns[i];
      }

      fl_draw(fragment, X + width, Y, cW, fl_height(),
              (Fl_Align)(FL_ALIGN_LEFT | FL_ALIGN_CLIP), 0, 0);

      // Advance to the next column...
      column ++;
      if (columns) {
	for (i = 0, width = 0; i < column && columns[i]; i ++)
	  width += columns[i];
      }
      else
	width = column * (int)(fl_height() * 0.6 * 8.0);
      ptr = fragment;
    }
    else
      *ptr++ = *t;
  }
  if (ptr > fragment) {
    // Nul terminate this fragment and draw it...
    *ptr = '\0';

    fl_draw(fragment, X + width, Y, W - width, fl_height(),
            (Fl_Align)(FL_ALIGN_LEFT | FL_ALIGN_CLIP), 0, 0);
  }
}